

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# workitem.cpp
# Opt level: O0

void depspawn::internal::Workitem::Clean_worklist(Workitem *worklist_wait_hint)

{
  int iVar1;
  ulong uVar2;
  size_type sVar3;
  reference ppWVar4;
  atomic<bool> *this;
  atomic<bool> *paVar5;
  reference pvVar6;
  Workitem *last_datain;
  __pointer_type in_RDI;
  Workitem *end;
  Workitem *begin;
  int i_1;
  int i;
  uint deletable_workitems;
  Workitem *p;
  Workitem *last_workitem;
  Workitem *lastkeep;
  undefined1 in_stack_ffffffffffffff9f;
  Workitem **in_stack_ffffffffffffffa0;
  atomic<depspawn::internal::Workitem_*> *in_stack_ffffffffffffffa8;
  vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
  *in_stack_ffffffffffffffb0;
  Workitem *this_00;
  int local_34;
  int local_30;
  uint local_2c;
  __pointer_type local_28;
  __pointer_type local_18;
  
  if ((Clean_worklist(depspawn::internal::Workitem*)::Dones == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Clean_worklist(depspawn::internal::Workitem*)::Dones), iVar1 != 0
     )) {
    std::vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>::
    vector((vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
            *)0x12e6ef);
    __cxa_atexit(std::
                 vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                 ::~vector,&Clean_worklist::Dones,&__dso_handle);
    __cxa_guard_release(&Clean_worklist(depspawn::internal::Workitem*)::Dones);
  }
  if ((Clean_worklist(depspawn::internal::Workitem*)::Deletable_Sublists == '\0') &&
     (iVar1 = __cxa_guard_acquire(&Clean_worklist(depspawn::internal::Workitem*)::Deletable_Sublists
                                 ), iVar1 != 0)) {
    std::
    vector<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
    ::vector((vector<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
              *)0x12e73b);
    __cxa_atexit(std::
                 vector<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
                 ::~vector,&Clean_worklist::Deletable_Sublists,&__dso_handle);
    __cxa_guard_release(&Clean_worklist(depspawn::internal::Workitem*)::Deletable_Sublists);
  }
  local_18 = std::atomic<depspawn::internal::Workitem_*>::load
                       (in_stack_ffffffffffffffa8,
                        (memory_order)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
  local_2c = 0;
  for (local_28 = local_18->next; local_28 != (__pointer_type)0x0; local_28 = local_28->next) {
    if (local_28->status == Deallocatable) {
      local_2c = local_2c + 1;
    }
    else {
      if (local_28->status == Done) {
        std::vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
        ::push_back(in_stack_ffffffffffffffb0,(value_type *)in_stack_ffffffffffffffa8);
      }
      if (4 < local_2c) {
        std::
        vector<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>,std::allocator<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>>>
        ::emplace_back<depspawn::internal::Workitem*&,depspawn::internal::Workitem*&>
                  ((vector<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
                    *)in_stack_ffffffffffffffb0,(Workitem **)in_stack_ffffffffffffffa8,
                   in_stack_ffffffffffffffa0);
        local_18->next = local_28;
      }
      local_18 = local_28;
      local_2c = 0;
    }
  }
  if (local_18->next != (Workitem *)0x0) {
    std::
    vector<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>,std::allocator<std::pair<depspawn::internal::Workitem*,depspawn::internal::Workitem*>>>
    ::emplace_back<depspawn::internal::Workitem*&,depspawn::internal::Workitem*&>
              ((vector<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
                *)in_stack_ffffffffffffffb0,(Workitem **)in_stack_ffffffffffffffa8,
               in_stack_ffffffffffffffa0);
    local_18->next = (Workitem *)0x0;
  }
  last_datain = (Workitem *)0x4;
  for (local_28 = std::atomic<depspawn::internal::Workitem_*>::load
                            (in_stack_ffffffffffffffa8,
                             (memory_order)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      local_28 != in_RDI; local_28 = local_28->next) {
    do {
    } while (local_28->status == Filling);
    if ((local_28->optFlags_ & 3U) == 0) break;
  }
  local_30 = 0;
  while( true ) {
    uVar2 = (ulong)local_30;
    sVar3 = std::
            vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
            ::size(&Clean_worklist::Dones);
    if (sVar3 <= uVar2) break;
    do {
      ppWVar4 = std::
                vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>
                ::operator[](&Clean_worklist::Dones,(long)local_30);
    } while ((*ppWVar4)->status == Done);
    local_30 = local_30 + 1;
  }
  std::vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_>::
  clear((vector<depspawn::internal::Workitem_*,_std::allocator<depspawn::internal::Workitem_*>_> *)
        0x12e960);
  local_34 = 0;
  while( true ) {
    this = (atomic<bool> *)(long)local_34;
    paVar5 = (atomic<bool> *)
             std::
             vector<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
             ::size(&Clean_worklist::Deletable_Sublists);
    if (paVar5 <= this) break;
    pvVar6 = std::
             vector<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
             ::operator[](&Clean_worklist::Deletable_Sublists,(long)local_34);
    this_00 = pvVar6->first;
    pvVar6 = std::
             vector<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
             ::operator[](&Clean_worklist::Deletable_Sublists,(long)local_34);
    LinkedListPool<depspawn::internal::Workitem,_true,_false>::freeLinkedList
              ((LinkedListPool<depspawn::internal::Workitem,_true,_false> *)this_00,pvVar6->second,
               last_datain,SUB81(uVar2 >> 0x38,0));
    local_34 = local_34 + 1;
  }
  std::
  vector<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
  ::clear((vector<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>,_std::allocator<std::pair<depspawn::internal::Workitem_*,_depspawn::internal::Workitem_*>_>_>
           *)0x12e9ef);
  std::atomic<bool>::operator=(this,(bool)in_stack_ffffffffffffff9f);
  return;
}

Assistant:

void Workitem::Clean_worklist(Workitem *worklist_wait_hint)
    { static std::vector<Workitem *> Dones;
      static std::vector< std::pair<Workitem *, Workitem *> > Deletable_Sublists;

      DEPSPAWN_PROFILEDEFINITION(const auto t0 = std::chrono::high_resolution_clock::now());
      //DEPSPAWN_PROFILEDEFINITION(unsigned int profile_deleted_workitems = 0);
      DEPSPAWN_PROFILEACTION(profile_erases++);

      Workitem *lastkeep = worklist.load();
      Workitem *last_workitem, *p;
      
      unsigned int deletable_workitems = 0;

      for(p = lastkeep->next; p != nullptr; p = p->next) {
        
        if( p->status != Status_t::Deallocatable ) {
          
          if(p->status == Status_t::Done) {
            Dones.push_back(p);
          }
          
          if (deletable_workitems > 4) { //We ask for a minimum that justifies the cost
            Deletable_Sublists.emplace_back(lastkeep->next, last_workitem); // Deleted sublist
            lastkeep->next = p;
            //DEPSPAWN_PROFILEACTION(profile_deleted_workitems += deletable_workitems);
          }
          
          lastkeep = p;
          deletable_workitems = 0;
          
        } else {
          deletable_workitems++;
        }
        
        last_workitem = p;
      }

      if (lastkeep->next != nullptr) {
        Deletable_Sublists.emplace_back(lastkeep->next, last_workitem);
        lastkeep->next = nullptr;
        //DEPSPAWN_PROFILEACTION(profile_deleted_workitems += deletable_workitems);
      }

      std::atomic_thread_fence(std::memory_order_seq_cst);

      //DEPSPAWN_PROFILEACTION(printf("D %u (%u) (%u) %c\n", profile_deleted_workitems, (unsigned)Dones.size(), (unsigned)Deletable_Sublists.size(), ));

      p = worklist.load(std::memory_order_seq_cst);
#ifdef __arm64__
        // Make sure changes are seen in insert_in_worklist upon insertion in worklist
        // See semantics of std::atomic_thread_fence
        while(!worklist.compare_exchange_weak(p, p));
#endif

      for( ; p != worklist_wait_hint; p = p->next) {
        
        while(p->status == Status_t::Filling) { } // Waits until work p has its dependencies
        
        if(! (p->optFlags_ & (OptFlags::PendingFills|OptFlags::FatherScape)) ) {
          break;
        }
        
      }

      for (int i = 0; i < Dones.size(); i++) {
        while (Dones[i]->status == Status_t::Done) { }
      }
      Dones.clear(); //Needed because it is static!

      for (int i = 0; i < Deletable_Sublists.size(); i++) {
        Workitem * const begin = Deletable_Sublists[i].first;
        Workitem * const end = Deletable_Sublists[i].second;
        DEPSPAWN_DEBUGACTION(
                             for(Workitem *q = begin;  q != end->next; q = q->next) {
                               assert(q->args == nullptr);
                               assert(q->status == Status_t::Deallocatable);
                               if (q->deps) {
                                 printf("%p -> %p\n", q, q->deps);
                                 assert(q->deps == nullptr);
                               }
                             }
                             ); // END DEPSPAWN_DEBUGACTION
        
        Workitem::Pool.freeLinkedList(begin, end);
      }
      Deletable_Sublists.clear(); //Needed because it is static!
      
      DEPSPAWN_PROFILEACTION(profile_time_eraser_waiting += std::chrono::duration <double>(std::chrono::high_resolution_clock::now() - t0).count());
      
      /*
       for(p = next; p; p = p->next) {
         last_workitem = p;
         if( p->status != Status_t::Deallocatable )
         lastkeep = p;
       }
       
       Workitem *dp = lastkeep->next; // Everything from here will be deleted
       lastkeep->next = nullptr;
       
       if (dp != nullptr) {
       
         for(p = worklist; p != worklist_wait_hint; p = p->next) {
           while(p->status == Status_t::Filling) { } // Waits until work p has its dependencies
           if(! (p->optFlags_ & (OptFlags::PendingFills|OptFlags::FatherScape)) ) {
             break;
           }
         }
       
         DEPSPAWN_PROFILEACTION(profile_time_eraser_waiting += std::chrono::duration <double>(std::chrono::high_resolution_clock::now() - t0).count());
       
         DEPSPAWN_DEBUGACTION(
           for(p = dp; p; p = p->next) {
             assert(p-> args == nullptr);
             if (p->deps) {
               printf("%p -> %p\n", p, p->deps);
               assert(p->deps == nullptr);
             }
           }
         ); // END DEPSPAWN_DEBUGACTION
       
         Workitem::Pool.freeLinkedList(dp, last_workitem);
       }
       */
      
      eraser_assigned = false;
    }